

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

TapBranch * __thiscall cfd::core::TapBranch::operator=(TapBranch *this,TapBranch *object)

{
  if (this != object) {
    this->has_leaf_ = object->has_leaf_;
    this->leaf_version_ = object->leaf_version_;
    Script::operator=(&this->script_,&object->script_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->root_commitment_,
               &(object->root_commitment_).data_);
    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
              (&this->branch_list_,&object->branch_list_);
  }
  return this;
}

Assistant:

TapBranch& TapBranch::operator=(const TapBranch& object) {
  if (this != &object) {
    has_leaf_ = object.has_leaf_;
    leaf_version_ = object.leaf_version_;
    script_ = object.script_;
    root_commitment_ = object.root_commitment_;
    branch_list_ = object.branch_list_;
  }
  return *this;
}